

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

string * clask::url_encode(string *__return_storage_ptr__,string *value,bool escape_slash)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  byte *pbVar5;
  ostream *poVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1c0;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  long local_198;
  ostringstream os;
  bool escape_slash_local;
  string *value_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::ios::fill((char)&local_198 + (char)*(undefined8 *)(local_198 + -0x18));
  std::ostream::operator<<((ostream *)&local_198,std::hex);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_1c0._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffe40);
    if (!bVar2) break;
    pbVar5 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end1);
    bVar1 = *pbVar5;
    iVar3 = isalnum((int)(char)bVar1);
    if ((((iVar3 == 0) && (bVar1 != 0x2d)) && (bVar1 != 0x5f)) &&
       ((bVar1 != 0x2e && (bVar1 != 0x7e)))) {
      if ((escape_slash) || (bVar1 != 0x2f)) {
        std::ostream::operator<<((ostream *)&local_198,std::uppercase);
        poVar6 = std::operator<<((ostream *)&local_198,'%');
        _Var4 = std::setw(2);
        poVar6 = std::operator<<(poVar6,_Var4);
        std::ostream::operator<<(poVar6,(uint)bVar1);
        std::ostream::operator<<((ostream *)&local_198,std::nouppercase);
      }
      else {
        std::operator<<((ostream *)&local_198,'/');
      }
    }
    else {
      std::operator<<((ostream *)&local_198,bVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string url_encode(const std::string &value, bool escape_slash = true) {
  std::ostringstream os;
  os.fill('0');
  os << std::hex;
  for (char c : value) {
    if (isalnum(c) || c == '-' || c == '_' || c == '.' || c == '~') {
      os << c;
      continue;
    }
    if (!escape_slash && c == '/') {
      os << c;
      continue;
    }
    os << std::uppercase;
    os << '%' << std::setw(2) << int((unsigned char) c);
    os << std::nouppercase;
  }
  return os.str();
}